

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

Atom_p __thiscall indigox::Molecule::GetAtomUniqueID(Molecule *this,uid_t i)

{
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Atom_p AVar4;
  
  p_Var1 = *(__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> **)(i + 0x48);
  _Var2._M_pi = in_RDX;
  for (p_Var3 = *(__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> **)(i + 0x40);
      p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var3);
    _Var2._M_pi = extraout_RDX;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (this->super_CountableObject<indigox::Molecule>).id_ == in_RDX) goto LAB_00109f15;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<indigox::Molecule>);
    _Var2._M_pi = extraout_RDX_00;
  }
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_00109f15:
  AVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  AVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Atom_p)AVar4.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::GetAtomUniqueID(uid_t i) {
  for (Atom_p atm : atoms_) {
    if (atm->GetUniqueID() == i) return atm;
  }
  return Atom_p();
}